

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int compare_map_idx_pair_asc(void *a,void *b)

{
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*(int *)((long)a + 4) == *(int *)((long)b + 4)) {
    local_4 = 0;
  }
  else if (*(int *)((long)b + 4) < *(int *)((long)a + 4)) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int compare_map_idx_pair_asc(const void *a, const void *b) {
  if (((RefBufMapData *)a)->disp_order == ((RefBufMapData *)b)->disp_order) {
    return 0;
  } else if (((const RefBufMapData *)a)->disp_order >
             ((const RefBufMapData *)b)->disp_order) {
    return 1;
  } else {
    return -1;
  }
}